

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O1

btMatrix3x3 *
MassMatrix(btMatrix3x3 *__return_storage_ptr__,btScalar im,btMatrix3x3 *iwi,btVector3 *r)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  btMatrix3x3 *r_1;
  long lVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined8 uStack_a0;
  undefined8 local_98;
  float local_90 [2];
  undefined8 local_88;
  float local_80;
  undefined4 local_7c;
  undefined8 local_78;
  float local_70 [2];
  btScalar local_68 [2];
  float afStack_60 [3];
  btScalar local_54;
  undefined8 local_50;
  undefined8 uStack_48;
  btScalar local_40;
  undefined4 local_3c;
  undefined1 local_38 [16];
  
  fVar11 = r->m_floats[2];
  fVar1 = r->m_floats[2];
  fVar2 = r->m_floats[0];
  fVar3 = r->m_floats[1];
  local_68[0] = im;
  stack0xffffffffffffff9c = 0;
  afStack_60[1] = 0.0;
  afStack_60[2] = 0.0;
  local_54 = im;
  local_50 = 0;
  uStack_48 = 0;
  local_40 = im;
  local_3c = 0;
  fVar13 = iwi->m_el[1].m_floats[0];
  fVar14 = iwi->m_el[0].m_floats[0];
  fVar15 = iwi->m_el[0].m_floats[1];
  fVar21 = iwi->m_el[2].m_floats[0];
  fVar16 = fVar21 * fVar3 + (fVar14 * 0.0 - fVar13 * fVar11);
  fVar4 = iwi->m_el[1].m_floats[1];
  fVar5 = iwi->m_el[2].m_floats[1];
  fVar18 = fVar5 * fVar3 + (fVar15 * 0.0 - fVar4 * fVar11);
  fVar6 = iwi->m_el[1].m_floats[2];
  fVar7 = iwi->m_el[0].m_floats[2];
  fVar8 = iwi->m_el[2].m_floats[2];
  fVar19 = fVar8 * fVar3 + (fVar7 * 0.0 - fVar6 * fVar11);
  fVar17 = (fVar14 * fVar11 + fVar13 * 0.0) - fVar21 * fVar2;
  fVar20 = (fVar15 * fVar11 + fVar4 * 0.0) - fVar5 * fVar2;
  local_38 = ZEXT416((uint)fVar11);
  fVar12 = (fVar11 * fVar7 + fVar6 * 0.0) - fVar8 * fVar2;
  fVar21 = fVar21 * 0.0 + (fVar13 * fVar2 - fVar14 * fVar3);
  fVar13 = fVar5 * 0.0 + (fVar4 * fVar2 - fVar15 * fVar3);
  fVar15 = fVar8 * 0.0 + (fVar6 * fVar2 - fVar7 * fVar3);
  fVar11 = -fVar11;
  fVar14 = -fVar3;
  local_98 = CONCAT44(fVar19 * fVar2 + fVar16 * fVar11 + fVar18 * 0.0,
                      fVar19 * fVar14 + fVar16 * 0.0 + fVar18 * fVar1);
  local_90[0] = fVar19 * 0.0 + (fVar3 * fVar16 - fVar18 * fVar2);
  local_90[1] = 0.0;
  local_88 = CONCAT44(fVar12 * fVar2 + fVar17 * fVar11 + fVar20 * 0.0,
                      fVar12 * fVar14 + fVar17 * 0.0 + fVar20 * fVar1);
  local_80 = fVar12 * 0.0 + (fVar3 * fVar17 - fVar20 * fVar2);
  local_7c = 0;
  local_78 = CONCAT44(fVar15 * fVar2 + fVar21 * fVar11 + fVar13 * 0.0,
                      fVar15 * fVar14 + fVar21 * 0.0 + fVar13 * fVar1);
  local_70[0] = fVar15 * 0.0 + (fVar3 * fVar21 - fVar13 * fVar2);
  local_70[1] = 0.0;
  lVar10 = 8;
  do {
    auVar9._4_4_ = (float)((ulong)*(undefined8 *)((long)local_70 + lVar10) >> 0x20) -
                   (float)((ulong)*(undefined8 *)((long)&uStack_a0 + lVar10) >> 0x20);
    auVar9._0_4_ = (float)*(undefined8 *)((long)local_70 + lVar10) -
                   (float)*(undefined8 *)((long)&uStack_a0 + lVar10);
    auVar9._8_4_ = *(float *)((long)local_68 + lVar10) - *(float *)((long)local_90 + lVar10 + -8);
    auVar9._12_4_ = 0;
    *(undefined1 (*) [16])((long)__return_storage_ptr__->m_el[0].m_floats + lVar10 + -8) = auVar9;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x38);
  return __return_storage_ptr__;
}

Assistant:

static inline btMatrix3x3	MassMatrix(btScalar im,const btMatrix3x3& iwi,const btVector3& r)
{
	const btMatrix3x3	cr=Cross(r);
	return(Sub(Diagonal(im),cr*iwi*cr));
}